

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

void __thiscall xmrig::CudaBackend::tick(CudaBackend *this,uint64_t ticks)

{
  uint32_t uVar1;
  Config *this_00;
  ulong in_RSI;
  long in_RDI;
  uint32_t seconds;
  CudaBackendPrivate *in_stack_00000250;
  
  Workers<xmrig::CudaLaunchData>::tick((Workers<xmrig::CudaLaunchData> *)this,ticks);
  this_00 = Base::config((Base *)**(undefined8 **)(in_RDI + 8));
  uVar1 = Config::healthPrintTime(this_00);
  if (((uVar1 != 0) && (in_RSI != 0)) && (in_RSI % (ulong)(uVar1 << 1) == 0)) {
    CudaBackendPrivate::printHealth(in_stack_00000250);
  }
  return;
}

Assistant:

void xmrig::CudaBackend::tick(uint64_t ticks)
{
    d_ptr->workers.tick(ticks);

#   ifdef XMRIG_FEATURE_NVML
    auto seconds = d_ptr->controller->config()->healthPrintTime();
    if (seconds && ticks && (ticks % (seconds * 2)) == 0) {
        d_ptr->printHealth();
    }
#   endif
}